

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_transform_base.h
# Opt level: O2

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::RotatePoint
          (PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *this,Point2 *p,
          int32_t rotation_count)

{
  undefined8 uVar1;
  int iVar2;
  int32_t iVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  
  if (in_ECX == 3) {
    iVar3 = *(int32_t *)CONCAT44(in_register_00000014,rotation_count);
    (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
    quantization_bits_ = -*(int *)(CONCAT44(in_register_00000014,rotation_count) + 4);
    (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
    max_quantized_value_ = iVar3;
  }
  else if (in_ECX == 2) {
    uVar1 = *(undefined8 *)CONCAT44(in_register_00000014,rotation_count);
    (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
    quantization_bits_ = -(int)uVar1;
    (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
    max_quantized_value_ = -(int)((ulong)uVar1 >> 0x20);
  }
  else if (in_ECX == 1) {
    iVar2 = *(int *)CONCAT44(in_register_00000014,rotation_count);
    (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
    quantization_bits_ = *(int32_t *)(CONCAT44(in_register_00000014,rotation_count) + 4);
    (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
    max_quantized_value_ = -iVar2;
  }
  else {
    VectorD<int,_2>::VectorD
              ((VectorD<int,_2> *)this,(Self *)CONCAT44(in_register_00000014,rotation_count));
  }
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 RotatePoint(Point2 p, int32_t rotation_count) const {
    switch (rotation_count) {
      case 1:
        return Point2(p[1], -p[0]);
      case 2:
        return Point2(-p[0], -p[1]);
      case 3:
        return Point2(-p[1], p[0]);
      default:
        return p;
    }
  }